

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O3

int64_t get_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  int iVar4;
  long lVar5;
  int j;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint8_t *puVar9;
  int i_1;
  int64_t sse;
  int64_t iVar10;
  uint8_t *puVar11;
  
  iVar1 = width + 0xf;
  if (-1 < width) {
    iVar1 = width;
  }
  uVar7 = width % 0x10;
  iVar2 = height + 0xf;
  if (-1 < height) {
    iVar2 = height;
  }
  iVar8 = height % 0x10;
  iVar4 = 0;
  if ((int)uVar7 < 1 || height < 1) {
    iVar10 = 0;
  }
  else {
    puVar9 = b + (int)(width - uVar7);
    puVar11 = a + (int)(width - uVar7);
    iVar10 = 0;
    do {
      uVar6 = 0;
      do {
        iVar10 = iVar10 + (ulong)(((uint)puVar11[uVar6] - (uint)puVar9[uVar6]) *
                                 ((uint)puVar11[uVar6] - (uint)puVar9[uVar6]));
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      puVar11 = puVar11 + a_stride;
      puVar9 = puVar9 + b_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  if (0 < iVar8) {
    puVar9 = a + (height - iVar8) * a_stride;
    puVar11 = b + (height - iVar8) * b_stride;
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (0 < (int)(width - uVar7)) {
        uVar6 = 0;
        do {
          lVar5 = lVar5 + (ulong)(((uint)puVar9[uVar6] - (uint)puVar11[uVar6]) *
                                 ((uint)puVar9[uVar6] - (uint)puVar11[uVar6]));
          uVar6 = uVar6 + 1;
        } while (width - uVar7 != uVar6);
      }
      puVar9 = puVar9 + a_stride;
      puVar11 = puVar11 + b_stride;
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar8);
    iVar10 = iVar10 + lVar5;
  }
  if (0xf < height) {
    iVar4 = 0;
    do {
      puVar9 = a;
      puVar11 = b;
      iVar8 = iVar1 >> 4;
      if (0xf < width) {
        do {
          iVar3 = (*aom_sse)(puVar9,a_stride,puVar11,b_stride,0x10,0x10);
          iVar10 = iVar10 + iVar3;
          iVar8 = iVar8 + -1;
          puVar9 = puVar9 + 0x10;
          puVar11 = puVar11 + 0x10;
        } while (iVar8 != 0);
      }
      a = a + (a_stride << 4);
      b = b + (b_stride << 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != iVar2 >> 4);
  }
  return iVar10;
}

Assistant:

static int64_t get_sse(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                       int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t distortion = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      distortion +=
          cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
              .distortion;
      ++mb_count;
    }
  }

  if (mb_count) distortion = (int)(distortion / mb_count);
  distortion = AOMMAX(1, distortion);

  return (int)distortion;
}